

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool dxil_spv::Converter::Impl::scan_samplers
               (ResourceRemappingInterface *iface,MDNode *samplers,ShaderStage stage)

{
  uint uVar1;
  uint uVar2;
  MDOperand *md;
  MDNode *node;
  undefined1 local_7c [8];
  VulkanBinding vulkan_binding;
  D3DBinding d3d_binding;
  uint range_size;
  uint bind_register;
  uint bind_space;
  uint index;
  MDNode *sampler;
  uint i;
  uint num_samplers;
  ShaderStage stage_local;
  MDNode *samplers_local;
  ResourceRemappingInterface *iface_local;
  
  uVar1 = LLVMBC::MDNode::getNumOperands(samplers);
  sampler._4_4_ = 0;
  while( true ) {
    if (uVar1 <= sampler._4_4_) {
      return true;
    }
    md = LLVMBC::MDNode::getOperand(samplers,sampler._4_4_);
    node = LLVMBC::cast<LLVMBC::MDNode>(md);
    get_constant_metadata<unsigned_int>(node,0);
    get_constant_metadata<unsigned_int>(node,3);
    get_constant_metadata<unsigned_int>(node,4);
    get_constant_metadata<unsigned_int>(node,5);
    vulkan_binding.descriptor_type._0_1_ = 0xe;
    vulkan_binding.bindless._4_4_ = stage;
    memset(local_7c,0,0x18);
    if ((iface != (ResourceRemappingInterface *)0x0) &&
       (uVar2 = (*iface->_vptr_ResourceRemappingInterface[3])
                          (iface,&vulkan_binding.bindless.use_heap,local_7c), (uVar2 & 1) == 0))
    break;
    sampler._4_4_ = sampler._4_4_ + 1;
  }
  return false;
}

Assistant:

bool Converter::Impl::scan_samplers(ResourceRemappingInterface *iface, const llvm::MDNode *samplers, ShaderStage stage)
{
	unsigned num_samplers = samplers->getNumOperands();
	for (unsigned i = 0; i < num_samplers; i++)
	{
		auto *sampler = llvm::cast<llvm::MDNode>(samplers->getOperand(i));
		unsigned index = get_constant_metadata(sampler, 0);
		unsigned bind_space = get_constant_metadata(sampler, 3);
		unsigned bind_register = get_constant_metadata(sampler, 4);
		unsigned range_size = get_constant_metadata(sampler, 5);

		D3DBinding d3d_binding = { stage, DXIL::ResourceKind::Sampler, index, bind_space, bind_register, range_size };
		VulkanBinding vulkan_binding = {};
		if (iface && !iface->remap_sampler(d3d_binding, vulkan_binding))
			return false;
	}

	return true;
}